

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_unsigned_long_&,_const_int_&> * __thiscall
Catch::ExprLhs<unsigned_long_const&>::operator==
          (BinaryExpr<const_unsigned_long_&,_const_int_&> *__return_storage_ptr__,
          ExprLhs<unsigned_long_const&> *this,int *rhs)

{
  int iVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  StringRef local_40;
  
  puVar2 = *(unsigned_long **)this;
  uVar3 = *puVar2;
  iVar1 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = uVar3 == (long)iVar1;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0018ca18;
  __return_storage_ptr__->m_lhs = puVar2;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }